

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
BCL::
Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
::Array(Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
        *this,uint64_t host,size_t size)

{
  bool bVar1;
  size_t sVar2;
  uint64_t uVar3;
  runtime_error *this_00;
  Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>
  *pCVar4;
  GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>_>
  GVar5;
  size_t local_60;
  size_t local_58;
  int local_4c;
  int i;
  CT *ldata;
  size_t local_30;
  size_t local_28;
  size_t size_local;
  uint64_t host_local;
  Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
  *this_local;
  
  this->my_size = size;
  this->my_host = host;
  GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>_>
  ::GlobalPtr(&this->data,(nullptr_t)0x0);
  sVar2 = BCL::rank();
  uVar3 = Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
          ::host(this);
  if (sVar2 == uVar3) {
    sVar2 = Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
            ::size(this);
    GVar5 = alloc<BCL::Container<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,BCL::serialize<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,0ul,void>,void>>
                      (sVar2);
    local_30 = GVar5.rank;
    (this->data).rank = local_30;
    local_28 = GVar5.ptr;
    (this->data).ptr = local_28;
    bVar1 = GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>_>
            ::operator==(&this->data,(nullptr_t)0x0);
    if (bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"BCL: Array does not have enough memory");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar4 = GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>_>
             ::local(&this->data);
    for (local_4c = 0;
        sVar2 = Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
                ::size(this), (ulong)(long)local_4c < sVar2; local_4c = local_4c + 1) {
      memset(pCVar4 + local_4c,0,0x20);
      Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>
      ::Container(pCVar4 + local_4c);
    }
  }
  uVar3 = Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
          ::host(this);
  GVar5 = broadcast<BCL::GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,BCL::serialize<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,0ul,void>,void>>>
                    (&this->data,uVar3);
  local_60 = GVar5.rank;
  (this->data).rank = local_60;
  local_58 = GVar5.ptr;
  (this->data).ptr = local_58;
  return;
}

Assistant:

Array(uint64_t host, size_t size) : my_host(host), my_size(size) {
      if (BCL::rank() == this->host()) {
        data = BCL::alloc <CT> (this->size());
        if (data == nullptr) {
          throw std::runtime_error("BCL: Array does not have enough memory");
        }
        CT* ldata = data.local();
        for (int i = 0; i < this->size(); i++) {
          new(&ldata[i]) CT ();
        }
      }
      data = BCL::broadcast(data, this->host());
    }